

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O1

void duckdb::SetArgumentType(ScalarFunction *bound_function,LogicalType *type,bool is_operator)

{
  vector<duckdb::LogicalType,_true> *this;
  LogicalType *pLVar1;
  reference pvVar2;
  undefined3 in_register_00000011;
  LogicalType *arg;
  LogicalType *pLVar3;
  
  if (CONCAT31(in_register_00000011,is_operator) == 0) {
    pLVar3 = (bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    pLVar1 = *(pointer *)
              ((long)&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data + 8);
    if (pLVar3 != pLVar1) {
      do {
        if (pLVar3 != type) {
          pLVar3->id_ = type->id_;
          pLVar3->physical_type_ = type->physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(&pLVar3->type_info_,&type->type_info_);
        }
        pLVar3 = pLVar3 + 1;
      } while (pLVar3 != pLVar1);
    }
    if (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.varargs == type)
    goto LAB_0112056e;
    (bound_function->super_BaseScalarFunction).super_SimpleFunction.varargs.id_ = type->id_;
    (bound_function->super_BaseScalarFunction).super_SimpleFunction.varargs.physical_type_ =
         type->physical_type_;
    pvVar2 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.varargs;
  }
  else {
    this = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
    pvVar2 = vector<duckdb::LogicalType,_true>::operator[](this,0);
    if (pvVar2 != type) {
      pvVar2->id_ = type->id_;
      pvVar2->physical_type_ = type->physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(&pvVar2->type_info_,&type->type_info_);
    }
    pvVar2 = vector<duckdb::LogicalType,_true>::operator[](this,1);
    if (pvVar2 == type) goto LAB_0112056e;
    pvVar2->id_ = type->id_;
    pvVar2->physical_type_ = type->physical_type_;
  }
  shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(&pvVar2->type_info_,&type->type_info_);
LAB_0112056e:
  if (&(bound_function->super_BaseScalarFunction).return_type != type) {
    (bound_function->super_BaseScalarFunction).return_type.id_ = type->id_;
    (bound_function->super_BaseScalarFunction).return_type.physical_type_ = type->physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(bound_function->super_BaseScalarFunction).return_type.type_info_,&type->type_info_)
    ;
    return;
  }
  return;
}

Assistant:

static void SetArgumentType(ScalarFunction &bound_function, const LogicalType &type, bool is_operator) {
	if (is_operator) {
		bound_function.arguments[0] = type;
		bound_function.arguments[1] = type;
		bound_function.return_type = type;
		return;
	}

	for (auto &arg : bound_function.arguments) {
		arg = type;
	}
	bound_function.varargs = type;
	bound_function.return_type = type;
}